

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrjpgcom.c
# Opt level: O1

void copy_variable(void)

{
  uint uVar1;
  int __c;
  int iVar2;
  
  uVar1 = read_2_bytes();
  putc(uVar1 >> 8 & 0xff,(FILE *)outfile);
  putc(uVar1 & 0xff,(FILE *)outfile);
  if (1 < uVar1) {
    for (iVar2 = uVar1 - 2; iVar2 != 0; iVar2 = iVar2 + -1) {
      __c = read_1_byte();
      putc(__c,(FILE *)outfile);
    }
    return;
  }
  copy_variable_cold_1();
  iVar2 = getc((FILE *)infile);
  if (iVar2 == -1) {
    read_1_byte_cold_1();
    iVar2 = getc((FILE *)infile);
    if (iVar2 == -1) {
      read_2_bytes_cold_2();
    }
    else {
      iVar2 = getc((FILE *)infile);
      if (iVar2 != -1) {
        return;
      }
    }
    read_2_bytes_cold_1();
    halt_baddata();
  }
  return;
}

Assistant:

static void
copy_variable(void)
/* Copy an unknown or uninteresting variable-length marker */
{
  unsigned int length;

  /* Get the marker parameter length count */
  length = read_2_bytes();
  write_2_bytes(length);
  /* Length includes itself, so must be at least 2 */
  if (length < 2)
    ERREXIT("Erroneous JPEG marker length");
  length -= 2;
  /* Copy the remaining bytes */
  while (length > 0) {
    write_1_byte(read_1_byte());
    length--;
  }
}